

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O2

Error * ot::commissioner::cose::MakeCoseKey
                  (Error *__return_storage_ptr__,ByteArray *aEncodedCoseKey,mbedtls_pk_context *aKey
                  ,ByteArray *aKeyId)

{
  char cVar1;
  ErrorCode EVar2;
  uint8_t *aBytes;
  uint8_t *puVar3;
  _Alloc_hider _Var4;
  int iVar5;
  mbedtls_pk_type_t mVar6;
  char *pcVar7;
  Error *pEVar8;
  size_t sVar9;
  char *pcVar10;
  string *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  format_args args_00;
  undefined1 local_578 [8];
  string sStack_570;
  parse_func local_550 [1];
  writer write;
  CborMap coseKey;
  string local_528;
  size_t encodedCoseKeyLength;
  undefined1 local_500 [40];
  uint8_t yPoint [65];
  uint8_t auStack_497 [15];
  uint8_t xPoint [65];
  uint8_t auStack_447 [15];
  uint8_t encodedCoseKey [1024];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  CborMap::CborMap(&coseKey);
  iVar5 = mbedtls_pk_can_do(aKey,MBEDTLS_PK_ECDSA);
  if (iVar5 == 0) {
LAB_001a7046:
    local_578 = (undefined1  [8])((ulong)local_578 & 0xffffffff00000000);
    sStack_570._M_dataplus._M_p = "Make COSE key without valid EC key";
    sStack_570._M_string_length = 0x22;
    sStack_570.field_2._M_allocated_capacity = 0;
    local_550[0] = (parse_func)0x0;
    pcVar7 = "Make COSE key without valid EC key";
    sStack_570.field_2._8_8_ = local_578;
    write.handler_ = (format_string_checker<char> *)local_578;
    while (pcVar7 != "") {
      cVar1 = *pcVar7;
      pcVar10 = pcVar7;
      while (cVar1 != '{') {
        pcVar10 = pcVar10 + 1;
        if (pcVar10 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar7,"");
          goto LAB_001a70d4;
        }
        cVar1 = *pcVar10;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar7,pcVar10);
      pcVar7 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar10,"",(format_string_checker<char> *)local_578);
    }
LAB_001a70d4:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_578;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_528,(v10 *)"Make COSE key without valid EC key",(string_view)ZEXT816(0x22),
               args);
    local_500._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_500 + 8),(string *)&local_528);
  }
  else {
    sStack_570._M_string_length = *(size_type *)&aKey->priv_id;
    local_578 = (undefined1  [8])aKey->pk_info;
    sStack_570._M_dataplus._M_p = (pointer)aKey->pk_ctx;
    mVar6 = mbedtls_pk_get_type((mbedtls_pk_context *)local_578);
    _Var4._M_p = sStack_570._M_dataplus._M_p;
    if ((uint *)sStack_570._M_dataplus._M_p == (uint *)0x0 ||
        mVar6 - MBEDTLS_PK_RSA_ALT < 0xfffffffd) goto LAB_001a7046;
    CborMap::Init((Error *)local_578,&coseKey);
    pEVar8 = Error::operator=(__return_storage_ptr__,(Error *)local_578);
    EVar2 = pEVar8->mCode;
    std::__cxx11::string::~string((string *)(local_578 + 8));
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    aBytes = (aKeyId->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (aKeyId->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (aBytes != puVar3) {
      CborMap::Put((Error *)local_578,&coseKey,2,aBytes,(long)puVar3 - (long)aBytes);
      pEVar8 = Error::operator=(__return_storage_ptr__,(Error *)local_578);
      EVar2 = pEVar8->mCode;
      std::__cxx11::string::~string((string *)(local_578 + 8));
      if (EVar2 != kNone) {
        return __return_storage_ptr__;
      }
    }
    CborMap::Put((Error *)local_578,&coseKey,1,2);
    pEVar8 = Error::operator=(__return_storage_ptr__,(Error *)local_578);
    EVar2 = pEVar8->mCode;
    std::__cxx11::string::~string((string *)(local_578 + 8));
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    if (*(uint *)_Var4._M_p - 3 < 3) {
      CborMap::Put((Error *)local_578,&coseKey,-1,*(uint *)_Var4._M_p - 2);
      pEVar8 = Error::operator=(__return_storage_ptr__,(Error *)local_578);
      EVar2 = pEVar8->mCode;
      std::__cxx11::string::~string((string *)(local_578 + 8));
      if (EVar2 != kNone) {
        return __return_storage_ptr__;
      }
      iVar5 = mbedtls_mpi_write_binary((mbedtls_mpi *)(_Var4._M_p + 0xd0),xPoint,0x41);
      if (iVar5 == 0) {
        sVar9 = mbedtls_mpi_size((mbedtls_mpi *)(_Var4._M_p + 0xd0));
        CborMap::Put((Error *)local_578,&coseKey,-2,auStack_447 + -sVar9,sVar9);
        pEVar8 = Error::operator=(__return_storage_ptr__,(Error *)local_578);
        EVar2 = pEVar8->mCode;
        std::__cxx11::string::~string((string *)(local_578 + 8));
        if (EVar2 != kNone) {
          return __return_storage_ptr__;
        }
        iVar5 = mbedtls_mpi_write_binary((mbedtls_mpi *)(_Var4._M_p + 0xe0),yPoint,0x41);
        if (iVar5 == 0) {
          sVar9 = mbedtls_mpi_size((mbedtls_mpi *)(_Var4._M_p + 0xe0));
          CborMap::Put((Error *)local_578,&coseKey,-3,auStack_497 + -sVar9,sVar9);
          pEVar8 = Error::operator=(__return_storage_ptr__,(Error *)local_578);
          EVar2 = pEVar8->mCode;
          std::__cxx11::string::~string((string *)(local_578 + 8));
          if (EVar2 != kNone) {
            return __return_storage_ptr__;
          }
          CborValue::Serialize
                    ((Error *)local_578,&coseKey.super_CborValue,encodedCoseKey,
                     &encodedCoseKeyLength,0x400);
          pEVar8 = Error::operator=(__return_storage_ptr__,(Error *)local_578);
          EVar2 = pEVar8->mCode;
          std::__cxx11::string::~string((string *)(local_578 + 8));
          if (EVar2 != kNone) {
            return __return_storage_ptr__;
          }
          std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char*>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)aEncodedCoseKey,
                     encodedCoseKey,encodedCoseKey + encodedCoseKeyLength);
          return __return_storage_ptr__;
        }
        ErrorFromMbedtlsError((Error *)local_578,iVar5);
      }
      else {
        ErrorFromMbedtlsError((Error *)local_578,iVar5);
      }
      Error::operator=(__return_storage_ptr__,(Error *)local_578);
      this = (string *)(local_578 + 8);
      goto LAB_001a7124;
    }
    local_578._0_4_ = 1;
    sStack_570._M_dataplus._M_p = "make COSE key with invalid EC2 curve group ID {}";
    sStack_570._M_string_length = 0x30;
    sStack_570.field_2._M_allocated_capacity = 0x100000000;
    local_550[0] = ::fmt::v10::detail::
                   parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    pcVar7 = "make COSE key with invalid EC2 curve group ID {}";
    sStack_570.field_2._8_8_ = local_578;
    write.handler_ = (format_string_checker<char> *)local_578;
    while (pcVar7 != "") {
      cVar1 = *pcVar7;
      pcVar10 = pcVar7;
      while (cVar1 != '{') {
        pcVar10 = pcVar10 + 1;
        if (pcVar10 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int>_>::
          writer::operator()((writer *)&write,pcVar7,"");
          goto LAB_001a72fc;
        }
        cVar1 = *pcVar10;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int>_>::writer::
      operator()((writer *)&write,pcVar7,pcVar10);
      pcVar7 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int>&>
                         (pcVar10,"",(format_string_checker<char> *)local_578);
    }
LAB_001a72fc:
    local_578 = (undefined1  [8])(ulong)*(uint *)_Var4._M_p;
    fmt.size_ = 1;
    fmt.data_ = (char *)0x30;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_578;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_528,(v10 *)"make COSE key with invalid EC2 curve group ID {}",fmt,args_00);
    local_500._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_500 + 8),(string *)&local_528);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_500);
  std::__cxx11::string::~string((string *)(local_500 + 8));
  this = &local_528;
LAB_001a7124:
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

Error MakeCoseKey(ByteArray &aEncodedCoseKey, const mbedtls_pk_context &aKey, const ByteArray &aKeyId)
{
    static constexpr size_t kMaxCoseKeyLength = 1024;

    Error                             error;
    const struct mbedtls_ecp_keypair *eckey;
    CborMap                           coseKey;
    int                               ec2Curve;
    uint8_t                           xPoint[MBEDTLS_ECP_MAX_PT_LEN];
    size_t                            xLength;
    uint8_t                           yPoint[MBEDTLS_ECP_MAX_PT_LEN];
    size_t                            yLength;
    uint8_t                           encodedCoseKey[kMaxCoseKeyLength];
    size_t                            encodedCoseKeyLength;

    if (!mbedtls_pk_can_do(&aKey, MBEDTLS_PK_ECDSA) || (eckey = mbedtls_pk_ec(aKey)) == nullptr)
    {
        ExitNow(error = ERROR_INVALID_ARGS("Make COSE key without valid EC key"));
    }

    SuccessOrExit(error = coseKey.Init());

    // Cose key id('kid')
    if (!aKeyId.empty())
    {
        SuccessOrExit(error = coseKey.Put(kKeyId, aKeyId.data(), aKeyId.size()));
    }

    // Cose key type
    SuccessOrExit(error = coseKey.Put(kKeyType, kKeyTypeEC2));

    // Cose key EC2 curve
    switch (eckey->grp.id)
    {
    case MBEDTLS_ECP_DP_SECP256R1:
        ec2Curve = kKeyEC2CurveP256;
        break;
    case MBEDTLS_ECP_DP_SECP384R1:
        ec2Curve = kKeyEC2CurveP384;
        break;
    case MBEDTLS_ECP_DP_SECP521R1:
        ec2Curve = kKeyEC2CurveP521;
        break;
    default:
        ExitNow(error = ERROR_INVALID_ARGS("make COSE key with invalid EC2 curve group ID {}",
                                           static_cast<int>(eckey->grp.id)));
    }
    SuccessOrExit(error = coseKey.Put(kKeyEC2Curve, ec2Curve));

    // Cose key EC2 X
    if (int fail = mbedtls_mpi_write_binary(&eckey->Q.X, xPoint, sizeof(xPoint)))
    {
        ExitNow(error = ErrorFromMbedtlsError(fail));
    }

    // 'mbedtls_mpi_write_binary' writes to the end of buffer
    xLength = mbedtls_mpi_size(&eckey->Q.X);
    SuccessOrExit(error = coseKey.Put(kKeyEC2X, xPoint + sizeof(xPoint) - xLength, xLength));

    // TODO(wgtdkp): handle the situation that Y point is not presented.
    // Cose key EC2 Y
    if (int fail = mbedtls_mpi_write_binary(&eckey->Q.Y, yPoint, sizeof(yPoint)))
    {
        ExitNow(error = ErrorFromMbedtlsError(fail));
    }

    yLength = mbedtls_mpi_size(&eckey->Q.Y);
    SuccessOrExit(error = coseKey.Put(kKeyEC2Y, yPoint + sizeof(yPoint) - yLength, yLength));

    SuccessOrExit(error = coseKey.Serialize(encodedCoseKey, encodedCoseKeyLength, sizeof(encodedCoseKey)));

    aEncodedCoseKey.assign(encodedCoseKey, encodedCoseKey + encodedCoseKeyLength);

exit:
    return error;
}